

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_CutCreateUnit(Nf_Cut_t *p,int i)

{
  int i_local;
  Nf_Cut_t *p_local;
  
  p->Delay = 0;
  p->Flow = 0.0;
  *(uint *)&p->field_0x10 = *(uint *)&p->field_0x10 & 0xfc000000 | 2;
  *(uint *)&p->field_0x10 = *(uint *)&p->field_0x10 & 0x7ffffff | 0x8000000;
  p->pLeaves[0] = i;
  p->Sign = 1L << ((byte)i & 0x3f);
  return 1;
}

Assistant:

static inline int Nf_CutCreateUnit( Nf_Cut_t * p, int i )
{
    p->Delay      = 0;
    p->Flow       = 0;
    p->iFunc      = 2;
    p->nLeaves    = 1;
    p->pLeaves[0] = i;
    p->Sign       = ((word)1) << (i & 0x3F);
    return 1;
}